

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O2

void init_fdtd_3D_medium(fdtd3D *fdtd,init_medium_fun_3D permeability_invR,
                        init_medium_fun_3D permittivity_invR,void *user)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  uintmax_t k;
  ulong uVar10;
  float_type fVar11;
  double dVar12;
  double local_80;
  double local_78;
  
  uVar10 = fdtd->sizeY;
  uVar2 = fdtd->sizeZ;
  pvVar5 = fdtd->permittivity_inv;
  pvVar9 = fdtd->permeability_inv;
  local_80 = 0.0;
  lVar1 = uVar2 * 8;
  lVar3 = uVar2 * uVar10 * 8;
  for (uVar6 = 0; uVar6 < fdtd->sizeX; uVar6 = uVar6 + 1) {
    local_78 = 0.0;
    pvVar4 = pvVar5;
    pvVar8 = pvVar9;
    for (uVar7 = 0; uVar7 < uVar10; uVar7 = uVar7 + 1) {
      dVar12 = 0.0;
      uVar10 = 0;
      while( true ) {
        if (uVar2 <= uVar10) break;
        fVar11 = (*permeability_invR)(local_80,local_78,dVar12,user);
        *(double *)((long)pvVar8 + uVar10 * 8) = 1.0 / (fVar11 * 1.2566370614359173e-06);
        fVar11 = (*permittivity_invR)(local_80,local_78,dVar12,user);
        *(double *)((long)pvVar4 + uVar10 * 8) = 1.0 / (fVar11 * 8.85418781762039e-12);
        uVar10 = uVar10 + 1;
        dVar12 = dVar12 + fdtd->dz;
        uVar2 = fdtd->sizeZ;
      }
      uVar10 = fdtd->sizeY;
      local_78 = local_78 + fdtd->dy;
      pvVar8 = (void *)((long)pvVar8 + lVar1);
      pvVar4 = (void *)((long)pvVar4 + lVar1);
    }
    local_80 = local_80 + fdtd->dx;
    pvVar9 = (void *)((long)pvVar9 + lVar3);
    pvVar5 = (void *)((long)pvVar5 + lVar3);
  }
  return;
}

Assistant:

void init_fdtd_3D_medium(struct fdtd3D *fdtd,
                         init_medium_fun_3D permeability_invR,
                         init_medium_fun_3D permittivity_invR, void *user) {
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permittivity_inv, fdtd->permittivity_inv);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permeability_inv, fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      float_type posZ = float_cst(0.);
      for (uintmax_t k = 0; k < fdtd->sizeZ; ++k, posZ += fdtd->dz) {
        permeability_inv[i][j][k] =
            float_cst(1.) / (permeability_invR(posX, posY, posZ, user) * mu0);
        permittivity_inv[i][j][k] =
            float_cst(1.) / (permittivity_invR(posX, posY, posZ, user) * eps0);
      }
    }
  }
}